

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O0

void __thiscall
t_delphi_generator::generate_delphi_property_reader_impl
          (t_delphi_generator *this,ostream *out,string *cls_prefix,string *name,t_type *type,
          t_field *tfield,string *fieldPrefix,bool is_xception_class)

{
  int iVar1;
  ostream *poVar2;
  string local_c0;
  string local_a0;
  string local_70;
  byte local_49;
  t_type *ptStack_48;
  bool is_xception;
  t_type *ftype;
  t_field *ptStack_38;
  bool is_xception_class_local;
  t_field *tfield_local;
  t_type *type_local;
  string *name_local;
  string *cls_prefix_local;
  ostream *out_local;
  t_delphi_generator *this_local;
  
  ftype._7_1_ = is_xception_class;
  ptStack_38 = tfield;
  tfield_local = (t_field *)type;
  type_local = (t_type *)name;
  name_local = cls_prefix;
  cls_prefix_local = (string *)out;
  out_local = (ostream *)this;
  ptStack_48 = t_field::get_type(tfield);
  iVar1 = (*(ptStack_48->super_t_doc)._vptr_t_doc[0xc])();
  local_49 = (byte)iVar1;
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"function ");
  poVar2 = std::operator<<(poVar2,(string *)cls_prefix);
  poVar2 = std::operator<<(poVar2,(string *)name);
  poVar2 = std::operator<<(poVar2,".");
  poVar2 = std::operator<<(poVar2,"Get");
  prop_name_abi_cxx11_(&local_70,this,ptStack_38,(bool)(ftype._7_1_ & 1));
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,": ");
  type_name_abi_cxx11_(&local_a0,this,ptStack_48,false,true,(bool)(local_49 & 1),true);
  poVar2 = std::operator<<(poVar2,(string *)&local_a0);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"begin");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  indent_up_impl(this);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"Result := ");
  poVar2 = std::operator<<(poVar2,(string *)fieldPrefix);
  prop_name_abi_cxx11_(&local_c0,this,ptStack_38,(bool)(ftype._7_1_ & 1));
  poVar2 = std::operator<<(poVar2,(string *)&local_c0);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c0);
  indent_down_impl(this);
  poVar2 = indent_impl(this,(ostream *)cls_prefix_local);
  poVar2 = std::operator<<(poVar2,"end;");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_property_reader_impl(ostream& out,
                                                              std::string cls_prefix,
                                                              std::string name,
                                                              t_type* type,
                                                              t_field* tfield,
                                                              std::string fieldPrefix,
                                                              bool is_xception_class) {
  (void)type;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "function " << cls_prefix << name << "."
                   << "Get" << prop_name(tfield, is_xception_class) << ": "
                   << type_name(ftype, false, true, is_xception, true) << ";" << endl;
  indent_impl(out) << "begin" << endl;
  indent_up_impl();
  indent_impl(out) << "Result := " << fieldPrefix << prop_name(tfield, is_xception_class) << ";"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl << endl;
}